

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_archive.hpp
# Opt level: O2

result_type __thiscall
pstore::serialize::archive::details::database_writer_policy::
putn<pstore::gsl::span<unsigned_long_const,2l>>
          (database_writer_policy *this,span<const_unsigned_long,_2L> sp)

{
  transaction_base *this_00;
  value_type vVar1;
  type num;
  typed_address<unsigned_long> addr;
  shared_ptr<unsigned_long> ptr;
  value_type local_80;
  unsigned_long *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_70 [2];
  storage_type<pstore::gsl::details::extent_type<2L>_> local_60;
  long local_58;
  pair<std::shared_ptr<unsigned_long>,_pstore::typed_address<unsigned_long>_> local_50;
  span_iterator<pstore::gsl::span<const_unsigned_long,_2L>,_false> local_38;
  span_iterator<pstore::gsl::span<const_unsigned_long,_2L>,_false> local_28;
  value_type *local_18;
  unsigned_long **local_10;
  
  local_80 = 0;
  local_78 = (unsigned_long *)0x0;
  a_Stack_70[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = this->transaction_;
  local_58 = 2;
  local_60 = sp.storage_.data_;
  num = unsigned_cast<long>(&local_58);
  transaction_base::alloc_rw<unsigned_long,void>(&local_50,this_00,num);
  local_18 = &local_80;
  local_10 = &local_78;
  std::tuple<std::shared_ptr<unsigned_long>&,pstore::typed_address<unsigned_long>&>::operator=
            ((tuple<std::shared_ptr<unsigned_long>&,pstore::typed_address<unsigned_long>&> *)
             &local_18,&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_50.first.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  local_38.span_ = (span<const_unsigned_long,_2L> *)&local_60;
  local_28.index_ = 0;
  local_38.index_ = 2;
  local_28.span_ = local_38.span_;
  std::
  copy<pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_long_const,2l>,false>,unsigned_long*>
            (&local_28,&local_38,local_78);
  vVar1 = local_80;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_70);
  return (result_type)vVar1;
}

Assistant:

auto putn (Span sp) -> result_type {
                        using element_type =
                            typename std::remove_const<typename Span::element_type>::type;

                        std::shared_ptr<element_type> ptr;
                        auto addr = typed_address<element_type>::null ();
                        std::tie (ptr, addr) = transaction_.template alloc_rw<element_type> (
                            unsigned_cast (sp.size ()));
                        std::copy (std::begin (sp), std::end (sp), ptr.get ());
                        return addr.to_address ();
                    }